

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTarget::ComputeVersionedName
          (cmTarget *this,string *vName,string *prefix,string *base,string *suffix,string *name,
          char *version)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (this->IsApple == true) {
    std::operator+(&local_48,prefix,base);
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + name->_M_string_length);
  }
  std::__cxx11::string::_M_assign((string *)vName);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  if (version != (char *)0x0) {
    std::__cxx11::string::append((char *)vName);
    std::__cxx11::string::append((char *)vName);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  if (this->IsApple == true) {
    pcVar2 = (suffix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + suffix->_M_string_length);
  }
  else {
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
  }
  std::__cxx11::string::_M_append((char *)vName,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmTarget::ComputeVersionedName(std::string& vName,
                                    std::string const& prefix,
                                    std::string const& base,
                                    std::string const& suffix,
                                    std::string const& name,
                                    const char* version) const
{
  vName = this->IsApple? (prefix+base) : name;
  if(version)
    {
    vName += ".";
    vName += version;
    }
  vName += this->IsApple? suffix : std::string();
}